

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_finalize_buffer(flatcc_builder_t *B,size_t *size_out)

{
  size_t __size;
  void *buffer_00;
  void *pvVar1;
  size_t size;
  void *buffer;
  size_t *size_out_local;
  flatcc_builder_t *B_local;
  
  __size = flatcc_builder_get_buffer_size(B);
  if (size_out != (size_t *)0x0) {
    *size_out = __size;
  }
  buffer_00 = malloc(__size);
  if (buffer_00 == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x7bd,"void *flatcc_builder_finalize_buffer(flatcc_builder_t *, size_t *)");
  }
  pvVar1 = flatcc_builder_copy_buffer(B,buffer_00,__size);
  if (pvVar1 == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x7c1,"void *flatcc_builder_finalize_buffer(flatcc_builder_t *, size_t *)");
  }
  if ((buffer_00 == (void *)0x0) && (size_out != (size_t *)0x0)) {
    *size_out = 0;
  }
  return buffer_00;
}

Assistant:

void *flatcc_builder_finalize_buffer(flatcc_builder_t *B, size_t *size_out)
{
    void * buffer;
    size_t size;

    size = flatcc_builder_get_buffer_size(B);

    if (size_out) {
        *size_out = size;
    }

    buffer = FLATCC_BUILDER_ALLOC(size);

    if (!buffer) {
        check(0, "failed to allocated memory for finalized buffer");
        goto done;
    }
    if (!flatcc_builder_copy_buffer(B, buffer, size)) {
        check(0, "default emitter declined to copy buffer");
        FLATCC_BUILDER_FREE(buffer);
        buffer = 0;
    }
done:
    if (!buffer && size_out) {
        *size_out = 0;
    }
    return buffer;
}